

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O2

string * __thiscall
FreeTypeFaceWrapper::NotDefGlyphName_abi_cxx11_
          (string *__return_storage_ptr__,FreeTypeFaceWrapper *this)

{
  string *__lhs;
  bool bVar1;
  FT_UInt FVar2;
  FT_UInt gindex;
  string local_40;
  
  __lhs = &this->mNotDefGlyphName;
  if ((this->mNotDefGlyphName)._M_string_length == 0) {
    if ((this->mFace->face_flags & 0x200) != 0) {
      FVar2 = FT_Get_Name_Index(this->mFace,".notdef");
      if (FVar2 == 0) {
        FT_Get_First_Char(this->mFace,&gindex);
        if (gindex != 0) {
          GetGlyphName_abi_cxx11_(&local_40,this,gindex,true);
          std::__cxx11::string::operator=((string *)__lhs,(string *)&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
    }
    bVar1 = std::operator==(__lhs,"");
    if (bVar1) {
      std::__cxx11::string::assign((char *)__lhs);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__lhs);
  return __return_storage_ptr__;
}

Assistant:

std::string FreeTypeFaceWrapper::NotDefGlyphName()
{
    // for special case of fonts that have glyph names, but don't define .notdef, use one of the existing chars (found a custom type 1 with that)
    
    if (mNotDefGlyphName.length() == 0) {
		if(FT_HAS_GLYPH_NAMES(mFace))
		{
			char* aString = (char*)".notdef";
			if(FT_Get_Name_Index(mFace,aString) == 0) {
				FT_UInt   gindex;
				FT_Get_First_Char( mFace, &gindex ); 
				if (gindex != 0)
				  mNotDefGlyphName = GetGlyphName(gindex, true);
			}
		}
		if (mNotDefGlyphName == "")  mNotDefGlyphName = ".notdef";
	}
	return mNotDefGlyphName;
}